

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O1

string * __thiscall
pbrt::StratifiedSampler::ToString_abi_cxx11_(string *__return_storage_ptr__,StratifiedSampler *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::Point2<int>const&,int_const&,int_const&,int_const&,int_const&,bool_const&,int_const&,pbrt::RNG_const&>
            (__return_storage_ptr__,
             "[ StratifiedSampler pixel: %s sampleIndex: %d dimension: %d xPixelSamples: %d yPixelSamples: %d jitter: %s seed: %d rng: %s ]"
             ,&this->pixel,&this->sampleIndex,&this->dimension,&this->xPixelSamples,
             &this->yPixelSamples,&this->jitter,&this->seed,&this->rng);
  return __return_storage_ptr__;
}

Assistant:

std::string StratifiedSampler::ToString() const {
    return StringPrintf(
        "[ StratifiedSampler pixel: %s sampleIndex: %d dimension: %d "
        "xPixelSamples: %d yPixelSamples: %d jitter: %s seed: %d rng: %s ]",
        pixel, sampleIndex, dimension, xPixelSamples, yPixelSamples, jitter, seed, rng);
}